

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  RefCntBuffer *pRVar3;
  aom_codec_err_t aVar4;
  undefined8 *puVar5;
  void *user_priv;
  
  if ((ctx->ppi->cpi->oxcf).algo_cfg.skip_postproc_filtering == false) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar5 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar5 + 1;
    }
    puVar2 = (uint *)*puVar5;
    if (puVar2 != (uint *)0x0) {
      user_priv = (void *)(ulong)*puVar2;
      aVar4 = AOM_CODEC_ERROR;
      if ((user_priv < (void *)0x8) &&
         (pRVar3 = (ctx->ppi->cpi->common).ref_frame_map[(long)user_priv],
         pRVar3 != (RefCntBuffer *)0x0)) {
        yuvconfig2image((aom_image_t *)(puVar2 + 2),&pRVar3->buf,user_priv);
        aVar4 = AOM_CODEC_OK;
      }
      return aVar4;
    }
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    aVar4 = AOM_CODEC_INCAPABLE;
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  av1_ref_frame_t *data = va_arg(args, av1_ref_frame_t *);
  if (data) {
    YV12_BUFFER_CONFIG *fb;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    fb = get_ref_frame(&frame_worker_data->pbi->common, data->idx);
    if (fb == NULL) return AOM_CODEC_ERROR;
    yuvconfig2image(&data->img, fb, NULL);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}